

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParsePrimMetas(AsciiParser *this,PrimMetaMap *args)

{
  bool bVar1;
  value_type *pvVar2;
  type *ptVar3;
  ulong uVar4;
  value_type *__in;
  string *__k;
  mapped_type *this_00;
  ostream *poVar5;
  string local_3f0;
  ostringstream local_3d0 [8];
  ostringstream ss_e_1;
  string local_250;
  ostringstream local_230 [8];
  ostringstream ss_e;
  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> local_b8;
  undefined1 local_70 [8];
  optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> m;
  char s;
  PrimMetaMap *args_local;
  AsciiParser *this_local;
  
  bVar1 = Expect(this,'(');
  if (bVar1) {
    bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00624763:
          this_local._7_1_ = 1;
          break;
        }
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          break;
        }
        bVar1 = Char1(this,(char *)((long)&m.contained + 0x3f));
        if (!bVar1) {
          this_local._7_1_ = 0;
          break;
        }
        if (m.contained._63_1_ == ')') goto LAB_00624763;
        Rewind(this,1);
        ParsePrimMeta(&local_b8,this);
        nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
        ::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_0>
                  ((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)local_70,
                   &local_b8);
        nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
        ::~optional(&local_b8);
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_70);
        if (bVar1) {
          pvVar2 = nonstd::optional_lite::
                   optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::value
                             ((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
                               *)local_70);
          ptVar3 = ::std::get<1ul,tinyusdz::ListEditQual,tinyusdz::MetaVariable>(pvVar2);
          MetaVariable::get_name_abi_cxx11_(ptVar3);
          uVar4 = ::std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            pvVar2 = nonstd::optional_lite::
                     optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::value
                               ((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
                                 *)local_70);
            __in = nonstd::optional_lite::
                   optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>::value
                             ((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
                               *)local_70);
            ptVar3 = ::std::get<1ul,tinyusdz::ListEditQual,tinyusdz::MetaVariable>(__in);
            __k = MetaVariable::get_name_abi_cxx11_(ptVar3);
            this_00 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
                      ::operator[](args,__k);
            ::std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>::operator=(this_00,pvVar2);
            bVar1 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_230);
            poVar5 = ::std::operator<<((ostream *)local_230,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ParsePrimMetas");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xc85);
            ::std::operator<<(poVar5," ");
            poVar5 = ::std::operator<<((ostream *)local_230,
                                       "[InternalError] Metadataum name is empty.");
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_250);
            ::std::__cxx11::string::~string((string *)&local_250);
            this_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_230);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_3d0);
          poVar5 = ::std::operator<<((ostream *)local_3d0,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ParsePrimMetas");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xc8a);
          ::std::operator<<(poVar5," ");
          poVar5 = ::std::operator<<((ostream *)local_3d0,"Failed to parse Meta value.");
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_3f0);
          ::std::__cxx11::string::~string((string *)&local_3f0);
          this_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_3d0);
        }
        nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>
        ::~optional((optional<std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_> *)local_70
                   );
      } while (!bVar1);
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParsePrimMetas(PrimMetaMap *args) {
  // '(' args ')'
  // args = list of argument, separated by newline.

  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    // std::cout << "skip comment/whitespace/nl failed\n";
    DCOUT("SkipCommentAndWhitespaceAndNewline failed.");
    return false;
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      // std::cout << "2: skip comment/whitespace/nl failed\n";
      return false;
    }

    char s;
    if (!Char1(&s)) {
      return false;
    }

    if (s == ')') {
      DCOUT("Prim meta end");
      // End
      break;
    }

    Rewind(1);

    DCOUT("Start PrimMeta parse.");

    // ty = std::pair<ListEditQual, MetaVariable>;
    if (auto m = ParsePrimMeta()) {
      DCOUT("PrimMeta: list-edit qual = "
            << tinyusdz::to_string(std::get<0>(m.value()))
            << ", name = " << std::get<1>(m.value()).get_name());

      if (std::get<1>(m.value()).get_name().empty()) {
        PUSH_ERROR_AND_RETURN("[InternalError] Metadataum name is empty.");
      }

      (*args)[std::get<1>(m.value()).get_name()] = m.value();
    } else {
      PUSH_ERROR_AND_RETURN("Failed to parse Meta value.");
    }
  }

  return true;
}